

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<unsigned_short>::test_small_numerators<(libdivide::Branching)0>
          (DivideTest<unsigned_short> *this,unsigned_short denom,
          divider<unsigned_short,_(libdivide::Branching)0> *the_divider)

{
  int32_t i;
  int iVar1;
  
  for (iVar1 = 0; iVar1 != 0x10000; iVar1 = iVar1 + 1) {
    test_one<(libdivide::Branching)0>(this,(unsigned_short)iVar1,denom,the_divider);
  }
  return;
}

Assistant:

void test_small_numerators(T denom, const divider<T, ALGO> &the_divider) {
        // test small numerators < 2^16
        // balance signed & unsigned testing
#if defined(__AVR__)
        int32_t small_stop = (limits::is_signed) ? (int32_t)1 << 7 : (uint32_t)1 << 8;
#else
        int32_t small_stop = (limits::is_signed) ? (int32_t)1 << 14 : (uint32_t)1 << 16;
#endif
        for (int32_t i = 0; i < small_stop; ++i) {
            test_one((T)i, denom, the_divider);

            if (limits::is_signed) {
                test_one((T)-i, denom, the_divider);
            }
        }
    }